

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

void __thiscall clipp::group::depth_first_traverser::undo(depth_first_traverser *this,memento *m)

{
  int iVar1;
  memento *pmVar2;
  bool bVar3;
  size_type sVar4;
  reference pvVar5;
  __normal_iterator<clipp::group::depth_first_traverser::context_*,_std::vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>_>
  local_40;
  const_iterator local_38;
  __normal_iterator<clipp::group::depth_first_traverser::context_*,_std::vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>_>
  local_30;
  __normal_iterator<clipp::group::depth_first_traverser::context_*,_std::vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>_>
  local_28;
  const_iterator local_20;
  memento *local_18;
  memento *m_local;
  depth_first_traverser *this_local;
  
  if (0 < m->level_) {
    iVar1 = m->level_;
    local_18 = m;
    m_local = (memento *)this;
    sVar4 = std::
            vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
            ::size(&this->stack_);
    if ((int)sVar4 < iVar1) {
      bVar3 = std::
              vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
              ::empty(&this->stack_);
      if ((bVar3) && (local_18->level_ == 1)) {
        std::
        vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
        ::push_back(&this->stack_,&local_18->context_);
      }
    }
    else {
      local_30._M_current =
           (context *)
           std::
           vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
           ::begin(&this->stack_);
      local_28 = __gnu_cxx::
                 __normal_iterator<clipp::group::depth_first_traverser::context_*,_std::vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>_>
                 ::operator+(&local_30,(long)local_18->level_);
      __gnu_cxx::
      __normal_iterator<clipp::group::depth_first_traverser::context_const*,std::vector<clipp::group::depth_first_traverser::context,std::allocator<clipp::group::depth_first_traverser::context>>>
      ::__normal_iterator<clipp::group::depth_first_traverser::context*>
                ((__normal_iterator<clipp::group::depth_first_traverser::context_const*,std::vector<clipp::group::depth_first_traverser::context,std::allocator<clipp::group::depth_first_traverser::context>>>
                  *)&local_20,&local_28);
      local_40._M_current =
           (context *)
           std::
           vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
           ::end(&this->stack_);
      __gnu_cxx::
      __normal_iterator<clipp::group::depth_first_traverser::context_const*,std::vector<clipp::group::depth_first_traverser::context,std::allocator<clipp::group::depth_first_traverser::context>>>
      ::__normal_iterator<clipp::group::depth_first_traverser::context*>
                ((__normal_iterator<clipp::group::depth_first_traverser::context_const*,std::vector<clipp::group::depth_first_traverser::context,std::allocator<clipp::group::depth_first_traverser::context>>>
                  *)&local_38,&local_40);
      std::
      vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ::erase(&this->stack_,local_20,local_38);
      pmVar2 = local_18;
      pvVar5 = std::
               vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
               ::back(&this->stack_);
      pvVar5->parent = (pmVar2->context_).parent;
      (pvVar5->cur)._M_current = (pmVar2->context_).cur._M_current;
      (pvVar5->end)._M_current = (pmVar2->context_).end._M_current;
    }
  }
  return;
}

Assistant:

void undo(const memento& m) {
            if(m.level_ < 1) return;
            if(m.level_ <= int(stack_.size())) {
                stack_.erase(stack_.begin() + m.level_, stack_.end());
                stack_.back() = m.context_;
            }
            else if(stack_.empty() && m.level_ == 1) {
                stack_.push_back(m.context_);
            }
        }